

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lu_byte luaH_getstr(Table *t,TString *key,TValue *res)

{
  lu_byte lVar1;
  TValue *val;
  TValue *res_local;
  TString *key_local;
  Table *t_local;
  
  val = Hgetstr(t,key);
  lVar1 = finishnodeget(val,res);
  return lVar1;
}

Assistant:

lu_byte luaH_getstr (Table *t, TString *key, TValue *res) {
  return finishnodeget(Hgetstr(t, key), res);
}